

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

InnerProductParameter * __thiscall
caffe::LayerParameter::mutable_inner_product_param(LayerParameter *this)

{
  InnerProductParameter *this_00;
  LayerParameter *this_local;
  
  set_has_inner_product_param(this);
  if (this->inner_product_param_ == (InnerProductParameter *)0x0) {
    this_00 = (InnerProductParameter *)operator_new(0x38);
    InnerProductParameter::InnerProductParameter(this_00);
    this->inner_product_param_ = this_00;
  }
  return this->inner_product_param_;
}

Assistant:

inline ::caffe::InnerProductParameter* LayerParameter::mutable_inner_product_param() {
  set_has_inner_product_param();
  if (inner_product_param_ == NULL) {
    inner_product_param_ = new ::caffe::InnerProductParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.inner_product_param)
  return inner_product_param_;
}